

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate2.hpp
# Opt level: O2

bool __thiscall
qclab::qgates::PointerGate2<double>::equals(PointerGate2<double> *this,QObject<double> *other)

{
  int iVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(other,&QObject<double>::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    other = *(QObject<double> **)(lVar2 + 0x10);
  }
  iVar1 = (*other->_vptr_QObject[0xe])(other,this->gate_);
  return SUB41(iVar1,0);
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate2< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }